

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O3

void __thiscall
VideoNode::VideoNode(VideoNode *this,path *project_root,string_view video_config_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PolledPipelineDesc *this_00;
  PolledFile *this_01;
  Resources *this_02;
  string_view filename;
  long *local_110;
  size_t local_108;
  long local_100 [2];
  shared_ptr<PolledFile> local_f0;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  path local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  path local_70;
  
  local_80._M_str = video_config_filename._M_str;
  local_80._M_len = video_config_filename._M_len;
  paVar1 = &local_c0._M_pathname.field_2;
  local_c0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"VideoNode","");
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"video","");
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__INode_001f83f0;
  (this->super_INode).class_name_ = &local_c0._M_pathname;
  (this->super_INode).name_._M_dataplus._M_p = (pointer)&(this->super_INode).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_INode).name_,local_e0,local_d8 + (long)local_e0);
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_pathname._M_dataplus._M_p,
                    local_c0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__VideoNode_001f8720;
  this->mode_index = 1;
  (this->preview).w = 0x500;
  (this->preview).h = 0x2d0;
  this_00 = (PolledPipelineDesc *)operator_new(0x28);
  this_01 = (PolledFile *)operator_new(0x10);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_70,&local_80);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_c0,project_root);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_c0,&local_70._M_pathname);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_110,local_c0._M_pathname._M_dataplus._M_p,
             local_c0._M_pathname._M_dataplus._M_p + local_c0._M_pathname._M_string_length);
  filename._M_str = (char *)local_110;
  filename._M_len = local_108;
  PolledFile::PolledFile(this_01,filename);
  local_f0.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<PolledFile*>
            (&local_f0.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_01);
  PolledPipelineDesc::PolledPipelineDesc(this_00,&local_f0);
  (this->polled_pipeline)._M_t.
  super___uniq_ptr_impl<PolledPipelineDesc,_std::default_delete<PolledPipelineDesc>_>._M_t.
  super__Tuple_impl<0UL,_PolledPipelineDesc_*,_std::default_delete<PolledPipelineDesc>_>.
  super__Head_base<0UL,_PolledPipelineDesc_*,_false>._M_head_impl = this_00;
  if (local_f0.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_c0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
  this_02 = (Resources *)operator_new(0xd8);
  Resources::Resources(this_02,project_root);
  (this->resources)._M_t.super___uniq_ptr_impl<Resources,_std::default_delete<Resources>_>._M_t.
  super__Tuple_impl<0UL,_Resources_*,_std::default_delete<Resources>_>.
  super__Head_base<0UL,_Resources_*,_false>._M_head_impl = this_02;
  (this->engine)._M_t.super___uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_>._M_t.
  super__Tuple_impl<0UL,_VideoEngine_*,_std::default_delete<VideoEngine>_>.
  super__Head_base<0UL,_VideoEngine_*,_false>._M_head_impl = (VideoEngine *)0x0;
  return;
}

Assistant:

VideoNode::VideoNode(fs::path project_root, std::string_view video_config_filename)
	: INode("VideoNode", "video")
	, preview{1280, 720}
	, polled_pipeline(new PolledPipelineDesc(
		std::shared_ptr<PolledFile>(
			new PolledFile(
				(project_root/video_config_filename).string()))))
	, resources(new Resources(project_root)) {
	GL_LOAD_FUNCS
}

VideoNode::~VideoNode() {}

void VideoNode::paint(float dt, const Timecode& tc, IScope &scope) {
	static unsigned int frame_seq = 0;
	frame_seq++;

	if (polled_pipeline->poll(frame_seq)) {
		engine.reset(new VideoEngine(*resources, polled_pipeline->get()));
		engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (engine)
		engine->paint(frame_seq, preview.w, preview.h, tc.row, dt, scope);
}

// void video_export(const ExportSettings &settings, const IAutomation &automation) {
// 	if (polled_pipeline && polled_pipeline->get()) {
// 		auto result = exportC(*resources, settings, *polled_pipeline->get().get(), automation);
// 		if (!result)
// 			MSG("Export error: %s", result.error().c_str());
// 	}
// }

void VideoNode::doUi() noexcept {
	if (ImGui::Combo("Resolution", &mode_index, c_mode_names, COUNTOF(c_mode_names))) {
		if (engine)
			engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (ImGui::Button("Make screensot") && engine) {
		// TODO filename picker
		// TODO incrementable filenames
		// TODO project-relative

		const char *filename = "screenshot.jpg";
		const Image screen = engine->makeScreenshot();
		const int result = stbi_write_jpg(filename, screen.w, screen.h, 3, screen.data.data(), 80);
		MSG("screenshot written to file %s, result: %d", filename, result);
	}
}

const renderdesc::Pipeline& VideoNode::getPipelineDesc() const {
	return *polled_pipeline->get().get();
}